

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVectorUtil.hpp
# Opt level: O2

bool tcu::allEqual<float,2>(Vector<float,_2> *a,Vector<float,_2> *b)

{
  bool bVar1;
  int i;
  long lVar2;
  
  bVar1 = true;
  for (lVar2 = 0; lVar2 != 2; lVar2 = lVar2 + 1) {
    if (bVar1) {
      bVar1 = b->m_data[lVar2] == a->m_data[lVar2];
    }
    else {
      bVar1 = false;
    }
  }
  return bVar1;
}

Assistant:

inline bool allEqual (const Vector<T, Size>& a, const Vector<T, Size>& b)
{
	bool res = true;
	for (int i = 0; i < Size; i++)
		res = res && a.m_data[i] == b.m_data[i];
	return res;
}